

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O0

void placalc::LoadItemToAmplification(void)

{
  uint local_2c;
  uint local_28;
  int expectedItemID;
  item_amplification ia;
  size_t i;
  FILE *pFStack_10;
  int opts;
  FILE *fin;
  
  pFStack_10 = fopen("input/amplifications.bin","rb");
  if (pFStack_10 == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","LoadItemToAmplification",
            "input/amplifications.bin");
    exit(1);
  }
  ia = (item_amplification)fread((void *)((long)&i + 4),4,1,pFStack_10);
  local_2c = 1;
  ia = (item_amplification)fread(&local_28,8,1,pFStack_10);
  while( true ) {
    if (ia == (item_amplification)0x0) {
      fclose(pFStack_10);
      return;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)item_to_amplification_,&expectedItemID);
    if (local_28 != local_2c) break;
    local_2c = local_2c + 1;
    ia = (item_amplification)fread(&local_28,8,1,pFStack_10);
  }
  fprintf(_stderr,
          "FATAL: %s: Item IDs are not contiguous. Expected item ID %d but read item ID %d\n",
          "LoadItemToAmplification",(ulong)local_2c,(ulong)local_28);
  exit(1);
}

Assistant:

void LoadItemToAmplification() {

    FILE * fin = fopen(AMPLIFICATION_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      AMPLIFICATION_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    item_amplification ia;
    int expectedItemID = 1;
    i = fread(&ia, sizeof(ia), 1, fin);
    while (i != 0) {
      item_to_amplification_.push_back(ia.amplification_id);
      if (ia.item_id != expectedItemID) {
	fprintf(stderr, "FATAL: %s: Item IDs are not contiguous. "
			"Expected item ID %d but read item ID %d\n",
		__func__, expectedItemID, ia.item_id);
	exit(EXIT_FAILURE);
      }
      ++expectedItemID;
      i = fread(&ia, sizeof(ia), 1, fin);
    }

    fclose(fin);

  }